

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netban.cpp
# Opt level: O2

CBan<NETADDR> * __thiscall
CNetBan::CBanPool<NETADDR,_1>::Add
          (CBanPool<NETADDR,_1> *this,CDataType *pData,CBanInfo *pInfo,CNetHash *pNetHash)

{
  int iVar1;
  CBan<NETADDR> *pCVar2;
  CBan<NETADDR> *pCVar3;
  undefined8 uVar4;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  long lVar9;
  CBanInfo *pCVar10;
  CBanInfo *pCVar11;
  CBan<NETADDR> *pCVar12;
  CBan<NETADDR> **ppCVar13;
  
  pCVar2 = this->m_pFirstFree;
  if (pCVar2 != (CBan<NETADDR> *)0x0) {
    *(undefined8 *)((pCVar2->m_Data).ip + 0xc) = *(undefined8 *)(pData->ip + 0xc);
    uVar5 = pData->ip[0];
    uVar6 = pData->ip[1];
    uVar7 = pData->ip[2];
    uVar8 = pData->ip[3];
    uVar4 = *(undefined8 *)(pData->ip + 4);
    (pCVar2->m_Data).type = pData->type;
    (pCVar2->m_Data).ip[0] = uVar5;
    (pCVar2->m_Data).ip[1] = uVar6;
    (pCVar2->m_Data).ip[2] = uVar7;
    (pCVar2->m_Data).ip[3] = uVar8;
    *(undefined8 *)((pCVar2->m_Data).ip + 4) = uVar4;
    pCVar10 = pInfo;
    pCVar11 = &pCVar2->m_Info;
    for (lVar9 = 0x12; lVar9 != 0; lVar9 = lVar9 + -1) {
      pCVar11->m_Expires = pCVar10->m_Expires;
      pCVar10 = (CBanInfo *)&pCVar10->m_LastInfoQuery;
      pCVar11 = (CBanInfo *)&pCVar11->m_LastInfoQuery;
    }
    pCVar2->m_NetHash = *pNetHash;
    pCVar3 = pCVar2->m_pNext;
    pCVar12 = pCVar2->m_pPrev;
    if (pCVar3 != (CBan<NETADDR> *)0x0) {
      pCVar3->m_pPrev = pCVar12;
    }
    ppCVar13 = &pCVar12->m_pNext;
    if (pCVar12 == (CBan<NETADDR> *)0x0) {
      ppCVar13 = &this->m_pFirstFree;
    }
    *ppCVar13 = pCVar3;
    ppCVar13 = this->m_paaHashList[pNetHash->m_HashIndex] + pNetHash->m_Hash;
    if (*ppCVar13 != (CBan<NETADDR> *)0x0) {
      (*ppCVar13)->m_pHashPrev = pCVar2;
    }
    pCVar2->m_pHashPrev = (CBan<NETADDR> *)0x0;
    pCVar2->m_pHashNext = *ppCVar13;
    *ppCVar13 = pCVar2;
    pCVar3 = this->m_pFirstUsed;
    if (this->m_pFirstUsed == (CBan<NETADDR> *)0x0) {
      this->m_pFirstUsed = pCVar2;
      pCVar2->m_pNext = (CBan<NETADDR> *)0x0;
      pCVar2->m_pPrev = (CBan<NETADDR> *)0x0;
    }
    else {
      do {
        pCVar12 = pCVar3;
        iVar1 = (pCVar12->m_Info).m_Expires;
        if ((iVar1 == -1) || ((pInfo->m_Expires != -1 && (pInfo->m_Expires <= iVar1)))) {
          pCVar2->m_pNext = pCVar12;
          pCVar3 = pCVar12->m_pPrev;
          pCVar2->m_pPrev = pCVar3;
          ppCVar13 = &pCVar3->m_pNext;
          if (pCVar3 == (CBan<NETADDR> *)0x0) {
            ppCVar13 = &this->m_pFirstUsed;
          }
          *ppCVar13 = pCVar2;
          pCVar12->m_pPrev = pCVar2;
          goto LAB_00134343;
        }
        pCVar3 = pCVar12->m_pNext;
      } while (pCVar12->m_pNext != (CBan<NETADDR> *)0x0);
      pCVar12->m_pNext = pCVar2;
      pCVar2->m_pPrev = pCVar12;
      pCVar2->m_pNext = (CBan<NETADDR> *)0x0;
    }
LAB_00134343:
    this->m_CountUsed = this->m_CountUsed + 1;
  }
  return pCVar2;
}

Assistant:

typename CNetBan::CBan<T> *CNetBan::CBanPool<T, HashCount>::Add(const T *pData, const CBanInfo *pInfo,  const CNetHash *pNetHash)
{
	if(!m_pFirstFree)
		return 0;

	// create new ban
	CBan<T> *pBan = m_pFirstFree;
	pBan->m_Data = *pData;
	pBan->m_Info = *pInfo;
	pBan->m_NetHash = *pNetHash;
	if(pBan->m_pNext)
		pBan->m_pNext->m_pPrev = pBan->m_pPrev;
	if(pBan->m_pPrev)
		pBan->m_pPrev->m_pNext = pBan->m_pNext;
	else
		m_pFirstFree = pBan->m_pNext;

	// add it to the hash list
	if(m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash])
		m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash]->m_pHashPrev = pBan;
	pBan->m_pHashPrev = 0;
	pBan->m_pHashNext = m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash];
	m_paaHashList[pNetHash->m_HashIndex][pNetHash->m_Hash] = pBan;

	// insert it into the used list
	if(m_pFirstUsed)
	{
		for(CBan<T> *p = m_pFirstUsed; ; p = p->m_pNext)
		{
			if(p->m_Info.m_Expires == CBanInfo::EXPIRES_NEVER || (pInfo->m_Expires != CBanInfo::EXPIRES_NEVER && pInfo->m_Expires <= p->m_Info.m_Expires))
			{
				// insert before
				pBan->m_pNext = p;
				pBan->m_pPrev = p->m_pPrev;
				if(p->m_pPrev)
					p->m_pPrev->m_pNext = pBan;
				else
					m_pFirstUsed = pBan;
				p->m_pPrev = pBan;
				break;
			}

			if(!p->m_pNext)
			{
				// last entry
				p->m_pNext = pBan;
				pBan->m_pPrev = p;
				pBan->m_pNext = 0;
				break;
			}
		}
	}
	else
	{
		m_pFirstUsed = pBan;
		pBan->m_pNext = pBan->m_pPrev = 0;
	}

	// update ban count
	++m_CountUsed;

	return pBan;
}